

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

size_t ll_size(ll_node *node)

{
  ll_node *local_20;
  ll_node *cur_node;
  size_t length;
  ll_node *node_local;
  
  cur_node = (ll_node *)0x0;
  for (local_20 = node; local_20 != (ll_node *)0x0; local_20 = local_20->next) {
    cur_node = (ll_node *)((long)&cur_node->value_ptr + 1);
  }
  return (size_t)cur_node;
}

Assistant:

size_t ll_size(const struct ll_node *node)
{
	size_t length = 0;
	struct ll_node *cur_node = (struct ll_node *)node;
	while (cur_node != NULL) {
		cur_node = cur_node->next;
		length++;
	}
	return length;
}